

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O0

void Handler_bouncetype_S_Actor(AActor *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  PClassActor *pPVar1;
  unsigned_short uVar2;
  undefined1 local_3c [2];
  TFlags<ActorBounceFlag,_unsigned_short> local_3a;
  undefined1 local_38 [2];
  TFlags<ActorBounceFlag,_unsigned_short> local_36;
  int local_34;
  char *pcStack_30;
  int match;
  char *id;
  FPropParam *params_local;
  Baggage *bag_local;
  PClassActor *info_local;
  AActor *defaults_local;
  
  pcStack_30 = params[1].s;
  id = (char *)params;
  params_local = (FPropParam *)bag;
  bag_local = (Baggage *)info;
  info_local = (PClassActor *)defaults;
  local_34 = MatchString(pcStack_30,Handler_bouncetype_S_Actor::names);
  if (local_34 < 0) {
    I_Error("Unknown bouncetype %s",pcStack_30);
    local_34 = 0;
  }
  operator|((EnumType)local_38,BOUNCE_TypeMask);
  TFlags<ActorBounceFlag,_unsigned_short>::operator~(&local_36);
  TFlags<ActorBounceFlag,_unsigned_short>::operator&=
            ((TFlags<ActorBounceFlag,_unsigned_short> *)&info_local[1].super_PClass.Defaults,
             &local_36);
  TFlags<ActorBounceFlag,_unsigned_short>::operator|=
            ((TFlags<ActorBounceFlag,_unsigned_short> *)&info_local[1].super_PClass.Defaults,
             Handler_bouncetype_S_Actor::flags[local_34]);
  pPVar1 = info_local + 1;
  operator|((EnumType)local_3c,BOUNCE_Actors);
  TFlags<ActorBounceFlag,_unsigned_short>::operator&
            (&local_3a,(Self *)&(pPVar1->super_PClass).Defaults);
  uVar2 = TFlags::operator_cast_to_unsigned_short((TFlags *)&local_3a);
  if (uVar2 != 0) {
    TFlags<ActorFlag2,_unsigned_int>::operator|=
              ((TFlags<ActorFlag2,_unsigned_int> *)&info_local->SourceLumpName,MF2_PASSMOBJ);
  }
  return;
}

Assistant:

DEFINE_PROPERTY(bouncetype, S, Actor)
{
	static const char *names[] = { "None", "Doom", "Heretic", "Hexen", "DoomCompat", "HereticCompat", "HexenCompat", "Grenade", "Classic", NULL };
	static const ActorBounceFlag flags[] = { BOUNCE_None,
		BOUNCE_Doom, BOUNCE_Heretic, BOUNCE_Hexen,
		BOUNCE_DoomCompat, BOUNCE_HereticCompat, BOUNCE_HexenCompat,
		BOUNCE_Grenade, BOUNCE_Classic, };
	PROP_STRING_PARM(id, 0);
	int match = MatchString(id, names);
	if (match < 0)
	{
		I_Error("Unknown bouncetype %s", id);
		match = 0;
	}
	defaults->BounceFlags &= ~(BOUNCE_TypeMask | BOUNCE_UseSeeSound);
	defaults->BounceFlags |= flags[match];
	if (defaults->BounceFlags & (BOUNCE_Actors | BOUNCE_AllActors))
	{
		// PASSMOBJ is irrelevant for normal missiles, but not for bouncers.
		defaults->flags2 |= MF2_PASSMOBJ;
	}
}